

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<short,signed_char>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,short *t_lhs,short *c_lhs,char *c_rhs)

{
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  Boxed_Value BVar2;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  char *local_38;
  char *c_rhs_local;
  short *c_lhs_local;
  short *t_lhs_local;
  Boxed_Value *t_bv_local;
  Boxed_Number *pBStack_10;
  Opers t_oper_local;
  
  local_38 = c_rhs;
  c_rhs_local = (char *)c_lhs;
  c_lhs_local = t_lhs;
  t_lhs_local = (short *)t_bv;
  t_bv_local._4_4_ = t_oper;
  pBStack_10 = this;
  switch(t_oper) {
  case equals:
    BVar2 = const_var((chaiscript *)this,(int)*c_lhs == (int)*c_rhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than:
    BVar2 = const_var((chaiscript *)this,(int)*c_lhs < (int)*c_rhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than:
    BVar2 = const_var((chaiscript *)this,(int)*c_rhs < (int)*c_lhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case less_than_equal:
    BVar2 = const_var((chaiscript *)this,(int)*c_lhs <= (int)*c_rhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case greater_than_equal:
    BVar2 = const_var((chaiscript *)this,(int)*c_rhs <= (int)*c_lhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case not_equal:
    BVar2 = const_var((chaiscript *)this,(int)*c_lhs != (int)*c_rhs);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    switch(t_oper) {
    case shift_left:
      local_4c = (int)*c_lhs << (*c_rhs & 0x1fU);
      BVar2 = const_var<int>((chaiscript *)this,&local_4c);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    case shift_right:
      local_50 = (int)*c_lhs >> (*c_rhs & 0x1fU);
      BVar2 = const_var<int>((chaiscript *)this,&local_50);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    case remainder:
      check_divide_by_zero<signed_char>(*c_rhs);
      local_54 = (int)*(short *)c_rhs_local % (int)*local_38;
      BVar2 = const_var<int>((chaiscript *)this,&local_54);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    case bitwise_and:
      local_58 = (int)*c_lhs & (int)*c_rhs;
      BVar2 = const_var<int>((chaiscript *)this,(int *)&local_58);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    case bitwise_or:
      local_5c = (int)*c_lhs | (int)*c_rhs;
      BVar2 = const_var<int>((chaiscript *)this,(int *)&local_5c);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    case bitwise_xor:
      local_60 = (int)*c_lhs ^ (int)*c_rhs;
      BVar2 = const_var<int>((chaiscript *)this,(int *)&local_60);
      _Var1._M_pi = BVar2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      break;
    default:
      if (t_lhs == (short *)0x0) {
switchD_0066428e_default:
        this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
        memset(this_00,0,8);
        detail::exception::bad_any_cast::bad_any_cast(this_00);
        __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                    detail::exception::bad_any_cast::~bad_any_cast);
      }
      switch(t_oper) {
      case assign:
        *t_lhs = (short)*c_rhs;
        Boxed_Value::Boxed_Value(&this->bv,t_bv);
        _Var1._M_pi = extraout_RDX;
        break;
      default:
        switch(t_oper) {
        case assign_bitwise_and:
          check_divide_by_zero<signed_char>(*c_rhs);
          *c_lhs_local = *c_lhs_local & (short)*local_38;
          Boxed_Value::Boxed_Value(&this->bv,(Boxed_Value *)t_lhs_local);
          _Var1._M_pi = extraout_RDX_04;
          break;
        case assign_bitwise_or:
          *t_lhs = *t_lhs | (short)*c_rhs;
          Boxed_Value::Boxed_Value(&this->bv,t_bv);
          _Var1._M_pi = extraout_RDX_05;
          break;
        case assign_shift_left:
          *t_lhs = (short)((int)*t_lhs << (*c_rhs & 0x1fU));
          Boxed_Value::Boxed_Value(&this->bv,t_bv);
          _Var1._M_pi = extraout_RDX_06;
          break;
        case assign_shift_right:
          *t_lhs = (short)((int)*t_lhs >> (*c_rhs & 0x1fU));
          Boxed_Value::Boxed_Value(&this->bv,t_bv);
          _Var1._M_pi = extraout_RDX_07;
          break;
        case assign_remainder:
          *t_lhs = *t_lhs % (short)*c_rhs;
          Boxed_Value::Boxed_Value(&this->bv,t_bv);
          _Var1._M_pi = extraout_RDX_08;
          break;
        case assign_bitwise_xor:
          *t_lhs = *t_lhs ^ (short)*c_rhs;
          Boxed_Value::Boxed_Value(&this->bv,t_bv);
          _Var1._M_pi = extraout_RDX_09;
          break;
        default:
          goto switchD_0066428e_default;
        }
        break;
      case assign_product:
        *t_lhs = *t_lhs * (short)*c_rhs;
        Boxed_Value::Boxed_Value(&this->bv,t_bv);
        _Var1._M_pi = extraout_RDX_00;
        break;
      case assign_sum:
        *t_lhs = *t_lhs + (short)*c_rhs;
        Boxed_Value::Boxed_Value(&this->bv,t_bv);
        _Var1._M_pi = extraout_RDX_01;
        break;
      case assign_quotient:
        check_divide_by_zero<signed_char>(*c_rhs);
        *c_lhs_local = *c_lhs_local / (short)*local_38;
        Boxed_Value::Boxed_Value(&this->bv,(Boxed_Value *)t_lhs_local);
        _Var1._M_pi = extraout_RDX_02;
        break;
      case assign_difference:
        *t_lhs = *t_lhs - (short)*c_rhs;
        Boxed_Value::Boxed_Value(&this->bv,t_bv);
        _Var1._M_pi = extraout_RDX_03;
      }
    }
    break;
  case sum:
    local_3c = (int)*c_lhs + (int)*c_rhs;
    BVar2 = const_var<int>((chaiscript *)this,&local_3c);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case quotient:
    check_divide_by_zero<signed_char>(*c_rhs);
    local_40 = (int)*(short *)c_rhs_local / (int)*local_38;
    BVar2 = const_var<int>((chaiscript *)this,&local_40);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case product:
    local_44 = (int)*c_lhs * (int)*c_rhs;
    BVar2 = const_var<int>((chaiscript *)this,&local_44);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case difference:
    local_48 = (int)*c_lhs - (int)*c_rhs;
    BVar2 = const_var<int>((chaiscript *)this,&local_48);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }